

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_linear.c
# Opt level: O0

int iterConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  mpt_iteratorLinear *d;
  void *ptr_local;
  mpt_type_t type_local;
  mpt_convertable *val_local;
  
  if (type == 0) {
    if (ptr == (void *)0x0) {
      val_local._4_4_ = 0x86;
    }
    else {
      *(uint8_t **)ptr = iterConv::fmt;
      val_local._4_4_ = 100;
    }
  }
  else if (type == 0x86) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val + 1;
    }
    val_local._4_4_ = 100;
  }
  else {
    val_local._4_4_ = -3;
  }
  return val_local._4_4_;
}

Assistant:

static int iterConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(iteratorLinear) *d = MPT_baseaddr(iteratorLinear, val, _mt);
	
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeIteratorPtr), 0 };
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
			return 'd';
		}
		return MPT_ENUM(TypeIteratorPtr);
	}
	if (type == MPT_ENUM(TypeIteratorPtr)) {
		if (ptr) *((const void **) ptr) = &d->_it;
		return 'd';
	}
	return MPT_ERROR(BadType);
}